

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O0

bool __thiscall
cmCacheManager::LoadCache
          (cmCacheManager *this,string *path,bool internal,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *excludes,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *includes)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  char *pcVar4;
  mapped_type *this_00;
  undefined8 uVar5;
  string *psVar6;
  ostream *poVar7;
  bool local_9a1;
  string local_968;
  byte local_942;
  allocator<char> local_941;
  string local_940 [32];
  undefined1 local_920 [8];
  ostringstream message;
  allocator<char> local_7a1;
  string local_7a0;
  cmValue local_780;
  cmValue dir;
  string oldcwd;
  string currentcwd;
  string local_730;
  cmValue local_710;
  cmValue oldDir;
  string local_700;
  allocator<char> local_6d9;
  string local_6d8;
  allocator<char> local_6b1;
  string local_6b0;
  cmValue local_690;
  cmValue cminor;
  uint v;
  cmValue local_660;
  cmValue cmajor;
  undefined1 local_638 [8];
  ostringstream error;
  allocator<char> local_4b9;
  string local_4b8;
  cmAlphaNum local_498;
  cmAlphaNum local_468;
  string local_438;
  _Self local_418;
  _Self local_410;
  _Self local_408;
  _Self local_400;
  allocator<char> local_3f1;
  string local_3f0;
  allocator<char> local_3c9;
  string local_3c8;
  undefined1 local_3a8 [8];
  CacheEntry e;
  string helpString;
  undefined1 local_318 [4];
  uint lineno;
  string entryKey;
  string buffer;
  char *realbuffer;
  ifstream fin;
  cmAlphaNum local_b8;
  cmAlphaNum local_88;
  undefined1 local_58 [8];
  string cacheFile;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *includes_local;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *excludes_local;
  bool internal_local;
  string *path_local;
  cmCacheManager *this_local;
  
  cacheFile.field_2._8_8_ = includes;
  cmAlphaNum::cmAlphaNum(&local_88,path);
  cmAlphaNum::cmAlphaNum(&local_b8,"/CMakeCache.txt");
  cmStrCat<>((string *)local_58,&local_88,&local_b8);
  if (internal) {
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>_>
    ::clear(&this->Cache);
  }
  bVar1 = cmsys::SystemTools::FileExists((string *)local_58);
  if (bVar1) {
    pcVar4 = (char *)std::__cxx11::string::c_str();
    std::ifstream::ifstream(&realbuffer,pcVar4,_S_in);
    bVar2 = std::ios::operator!((ios *)((long)&realbuffer + *(long *)(realbuffer + -0x18)));
    if ((bVar2 & 1) == 0) {
      std::__cxx11::string::string((string *)(entryKey.field_2._M_local_buf + 8));
      std::__cxx11::string::string((string *)local_318);
      helpString.field_2._12_4_ = 0;
      while (bVar1 = std::ios::operator_cast_to_bool
                               ((ios *)((long)&realbuffer + *(long *)(realbuffer + -0x18))), bVar1)
      {
        std::__cxx11::string::string((string *)&e.Initialized);
        CacheEntry::CacheEntry((CacheEntry *)local_3a8);
        cmsys::SystemTools::GetLineFromStream
                  ((istream *)&realbuffer,(string *)((long)&entryKey.field_2 + 8),(bool *)0x0,
                   0xffffffffffffffff);
        helpString.field_2._12_4_ = helpString.field_2._12_4_ + 1;
        buffer.field_2._8_8_ = std::__cxx11::string::c_str();
        while( true ) {
          bVar1 = false;
          if ((((*(char *)buffer.field_2._8_8_ != '0') &&
               (bVar1 = true, *(char *)buffer.field_2._8_8_ != ' ')) &&
              (bVar1 = true, *(char *)buffer.field_2._8_8_ != '\t')) &&
             (bVar1 = true, *(char *)buffer.field_2._8_8_ != '\r')) {
            bVar1 = *(char *)buffer.field_2._8_8_ == '\n';
          }
          if (!bVar1) break;
          if (*(char *)buffer.field_2._8_8_ == '\n') {
            helpString.field_2._12_4_ = helpString.field_2._12_4_ + 1;
          }
          buffer.field_2._8_8_ = buffer.field_2._8_8_ + 1;
        }
        if ((*(char *)buffer.field_2._8_8_ != '#') && (*(char *)buffer.field_2._8_8_ != '\0')) {
          while( true ) {
            bVar1 = false;
            if (*(char *)buffer.field_2._8_8_ == '/') {
              bVar1 = *(char *)(buffer.field_2._8_8_ + 1) == '/';
            }
            if (!bVar1) break;
            if ((*(char *)(buffer.field_2._8_8_ + 2) == '\\') &&
               (*(char *)(buffer.field_2._8_8_ + 3) == 'n')) {
              std::__cxx11::string::operator+=((string *)&e.Initialized,'\n');
              std::__cxx11::string::operator+=
                        ((string *)&e.Initialized,(char *)(buffer.field_2._8_8_ + 4));
            }
            else {
              std::__cxx11::string::operator+=
                        ((string *)&e.Initialized,(char *)(buffer.field_2._8_8_ + 2));
            }
            cmsys::SystemTools::GetLineFromStream
                      ((istream *)&realbuffer,(string *)((long)&entryKey.field_2 + 8),(bool *)0x0,
                       0xffffffffffffffff);
            helpString.field_2._12_4_ = helpString.field_2._12_4_ + 1;
            buffer.field_2._8_8_ = std::__cxx11::string::c_str();
            std::ios::operator!((ios *)((long)&realbuffer + *(long *)(realbuffer + -0x18)));
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3c8,"HELPSTRING",&local_3c9);
          pcVar4 = (char *)std::__cxx11::string::c_str();
          CacheEntry::SetProperty((CacheEntry *)local_3a8,&local_3c8,pcVar4);
          std::__cxx11::string::~string((string *)&local_3c8);
          std::allocator<char>::~allocator(&local_3c9);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3f0,(char *)buffer.field_2._8_8_,&local_3f1);
          bVar1 = cmState::ParseCacheEntry
                            (&local_3f0,(string *)local_318,(string *)local_3a8,
                             (CacheEntryType *)(e.Value.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)&local_3f0);
          std::allocator<char>::~allocator(&local_3f1);
          if (bVar1) {
            local_400._M_node =
                 (_Base_ptr)
                 std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::find(excludes,(key_type *)local_318);
            local_408._M_node =
                 (_Base_ptr)
                 std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end(excludes);
            bVar1 = std::operator==(&local_400,&local_408);
            if (bVar1) {
              local_9a1 = true;
              if ((!internal) && (local_9a1 = true, e.Value.field_2._8_4_ == 4)) {
                local_410._M_node =
                     (_Base_ptr)
                     std::
                     set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::find((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)cacheFile.field_2._8_8_,(key_type *)local_318);
                local_418._M_node =
                     (_Base_ptr)
                     std::
                     set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)cacheFile.field_2._8_8_);
                local_9a1 = std::operator!=(&local_410,&local_418);
              }
              if (local_9a1 != false) {
                if (!internal) {
                  e.Value.field_2._8_4_ = 4;
                  cmAlphaNum::cmAlphaNum(&local_468,"DO NOT EDIT, ");
                  cmAlphaNum::cmAlphaNum(&local_498,(string *)local_318);
                  cmStrCat<char[67],std::__cxx11::string,char[16]>
                            (&local_438,&local_468,&local_498,
                             (char (*) [67])
                             " loaded from external file.  To change this value edit this file: ",
                             path,(char (*) [16])"/CMakeCache.txt");
                  std::__cxx11::string::operator=((string *)&e.Initialized,(string *)&local_438);
                  std::__cxx11::string::~string((string *)&local_438);
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_4b8,"HELPSTRING",&local_4b9);
                  pcVar4 = (char *)std::__cxx11::string::c_str();
                  CacheEntry::SetProperty((CacheEntry *)local_3a8,&local_4b8,pcVar4);
                  std::__cxx11::string::~string((string *)&local_4b8);
                  std::allocator<char>::~allocator(&local_4b9);
                }
                bVar1 = ReadPropertyEntry(this,(string *)local_318,(CacheEntry *)local_3a8);
                if (!bVar1) {
                  e.Properties.Map_._M_h._M_single_bucket._0_1_ = 1;
                  this_00 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>_>
                            ::operator[](&this->Cache,(key_type *)local_318);
                  CacheEntry::operator=(this_00,(CacheEntry *)local_3a8);
                }
              }
            }
          }
          else {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_638);
            poVar7 = std::operator<<((ostream *)local_638,"Parse error in cache file ");
            poVar7 = std::operator<<(poVar7,(string *)local_58);
            poVar7 = std::operator<<(poVar7," on line ");
            poVar7 = (ostream *)std::ostream::operator<<(poVar7,helpString.field_2._12_4_);
            poVar7 = std::operator<<(poVar7,". Offending entry: ");
            std::operator<<(poVar7,(char *)buffer.field_2._8_8_);
            std::__cxx11::ostringstream::str();
            cmSystemTools::Error((string *)&cmajor);
            std::__cxx11::string::~string((string *)&cmajor);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_638);
          }
        }
        CacheEntry::~CacheEntry((CacheEntry *)local_3a8);
        std::__cxx11::string::~string((string *)&e.Initialized);
      }
      this->CacheMajorVersion = 0;
      this->CacheMinorVersion = 0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&v,"CMAKE_CACHE_MAJOR_VERSION",
                 (allocator<char> *)((long)&cminor.Value + 7));
      local_660 = GetInitializedCacheValue(this,(string *)&v);
      std::__cxx11::string::~string((string *)&v);
      std::allocator<char>::~allocator((allocator<char> *)((long)&cminor.Value + 7));
      bVar1 = cmValue::operator_cast_to_bool(&local_660);
      if (bVar1) {
        cminor.Value._0_4_ = 0;
        cmValue::operator->[abi_cxx11_(&local_660);
        uVar5 = std::__cxx11::string::c_str();
        iVar3 = __isoc99_sscanf(uVar5,"%u",&cminor);
        if (iVar3 == 1) {
          this->CacheMajorVersion = (uint)cminor.Value;
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_6b0,"CMAKE_CACHE_MINOR_VERSION",&local_6b1);
        local_690 = GetInitializedCacheValue(this,&local_6b0);
        std::__cxx11::string::~string((string *)&local_6b0);
        std::allocator<char>::~allocator(&local_6b1);
        bVar1 = cmValue::operator_cast_to_bool(&local_690);
        if (bVar1) {
          cmValue::operator->[abi_cxx11_(&local_690);
          uVar5 = std::__cxx11::string::c_str();
          iVar3 = __isoc99_sscanf(uVar5,"%u",&cminor);
          if (iVar3 == 1) {
            this->CacheMinorVersion = (uint)cminor.Value;
          }
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_6d8,"CMAKE_CACHE_MINOR_VERSION",&local_6d9);
        AddCacheEntry(this,&local_6d8,"0",
                      "Minor version of cmake used to create the current loaded cache",INTERNAL);
        std::__cxx11::string::~string((string *)&local_6d8);
        std::allocator<char>::~allocator(&local_6d9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_700,"CMAKE_CACHE_MAJOR_VERSION",
                   (allocator<char> *)((long)&oldDir.Value + 7));
        AddCacheEntry(this,&local_700,"0",
                      "Major version of cmake used to create the current loaded cache",INTERNAL);
        std::__cxx11::string::~string((string *)&local_700);
        std::allocator<char>::~allocator((allocator<char> *)((long)&oldDir.Value + 7));
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_730,"CMAKE_CACHEFILE_DIR",
                 (allocator<char> *)(currentcwd.field_2._M_local_buf + 0xf));
      local_710 = GetInitializedCacheValue(this,&local_730);
      std::__cxx11::string::~string((string *)&local_730);
      std::allocator<char>::~allocator((allocator<char> *)(currentcwd.field_2._M_local_buf + 0xf));
      if ((internal) && (bVar1 = cmValue::operator_cast_to_bool(&local_710), bVar1)) {
        std::__cxx11::string::string((string *)(oldcwd.field_2._M_local_buf + 8),(string *)path);
        psVar6 = cmValue::operator*[abi_cxx11_(&local_710);
        std::__cxx11::string::string((string *)&dir,(string *)psVar6);
        cmsys::SystemTools::ConvertToUnixSlashes((string *)((long)&oldcwd.field_2 + 8));
        std::__cxx11::string::operator+=
                  ((string *)(oldcwd.field_2._M_local_buf + 8),"/CMakeCache.txt");
        std::__cxx11::string::operator+=((string *)&dir,"/CMakeCache.txt");
        bVar1 = cmsys::SystemTools::SameFile((string *)&dir,(string *)((long)&oldcwd.field_2 + 8));
        if (!bVar1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_7a0,"CMAKE_CACHEFILE_DIR",&local_7a1);
          local_780 = GetInitializedCacheValue(this,&local_7a0);
          std::__cxx11::string::~string((string *)&local_7a0);
          std::allocator<char>::~allocator(&local_7a1);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_920);
          poVar7 = std::operator<<((ostream *)local_920,"The current CMakeCache.txt directory ");
          poVar7 = std::operator<<(poVar7,(string *)(oldcwd.field_2._M_local_buf + 8));
          poVar7 = std::operator<<(poVar7," is different than the directory ");
          bVar1 = cmValue::operator_cast_to_bool(&local_780);
          local_942 = 0;
          if (bVar1) {
            psVar6 = cmValue::operator*[abi_cxx11_(&local_780);
            std::__cxx11::string::string(local_940,(string *)psVar6);
          }
          else {
            std::allocator<char>::allocator();
            local_942 = 1;
            std::__cxx11::string::string<std::allocator<char>>(local_940,"",&local_941);
          }
          poVar7 = std::operator<<(poVar7,local_940);
          std::operator<<(poVar7,
                          " where CMakeCache.txt was created. This may result in binaries being created in the wrong place. If you are not sure, reedit the CMakeCache.txt"
                         );
          std::__cxx11::string::~string(local_940);
          if ((local_942 & 1) != 0) {
            std::allocator<char>::~allocator(&local_941);
          }
          std::__cxx11::ostringstream::str();
          cmSystemTools::Error(&local_968);
          std::__cxx11::string::~string((string *)&local_968);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_920);
        }
        std::__cxx11::string::~string((string *)&dir);
        std::__cxx11::string::~string((string *)(oldcwd.field_2._M_local_buf + 8));
      }
      this->CacheLoaded = true;
      this_local._7_1_ = true;
      std::__cxx11::string::~string((string *)local_318);
      std::__cxx11::string::~string((string *)(entryKey.field_2._M_local_buf + 8));
    }
    else {
      this_local._7_1_ = false;
    }
    std::ifstream::~ifstream(&realbuffer);
  }
  else {
    CleanCMakeFiles(this,path);
    this_local._7_1_ = false;
  }
  std::__cxx11::string::~string((string *)local_58);
  return this_local._7_1_;
}

Assistant:

bool cmCacheManager::LoadCache(const std::string& path, bool internal,
                               std::set<std::string>& excludes,
                               std::set<std::string>& includes)
{
  std::string cacheFile = cmStrCat(path, "/CMakeCache.txt");
  // clear the old cache, if we are reading in internal values
  if (internal) {
    this->Cache.clear();
  }
  if (!cmSystemTools::FileExists(cacheFile)) {
    this->CleanCMakeFiles(path);
    return false;
  }

  cmsys::ifstream fin(cacheFile.c_str());
  if (!fin) {
    return false;
  }
  const char* realbuffer;
  std::string buffer;
  std::string entryKey;
  unsigned int lineno = 0;
  while (fin) {
    // Format is key:type=value
    std::string helpString;
    CacheEntry e;
    cmSystemTools::GetLineFromStream(fin, buffer);
    lineno++;
    realbuffer = buffer.c_str();
    while (*realbuffer != '0' &&
           (*realbuffer == ' ' || *realbuffer == '\t' || *realbuffer == '\r' ||
            *realbuffer == '\n')) {
      if (*realbuffer == '\n') {
        lineno++;
      }
      realbuffer++;
    }
    // skip blank lines and comment lines
    if (realbuffer[0] == '#' || realbuffer[0] == 0) {
      continue;
    }
    while (realbuffer[0] == '/' && realbuffer[1] == '/') {
      if ((realbuffer[2] == '\\') && (realbuffer[3] == 'n')) {
        helpString += '\n';
        helpString += &realbuffer[4];
      } else {
        helpString += &realbuffer[2];
      }
      cmSystemTools::GetLineFromStream(fin, buffer);
      lineno++;
      realbuffer = buffer.c_str();
      if (!fin) {
        continue;
      }
    }
    e.SetProperty("HELPSTRING", helpString.c_str());
    if (cmState::ParseCacheEntry(realbuffer, entryKey, e.Value, e.Type)) {
      if (excludes.find(entryKey) == excludes.end()) {
        // Load internal values if internal is set.
        // If the entry is not internal to the cache being loaded
        // or if it is in the list of internal entries to be
        // imported, load it.
        if (internal || (e.Type != cmStateEnums::INTERNAL) ||
            (includes.find(entryKey) != includes.end())) {
          // If we are loading the cache from another project,
          // make all loaded entries internal so that it is
          // not visible in the gui
          if (!internal) {
            e.Type = cmStateEnums::INTERNAL;
            helpString = cmStrCat("DO NOT EDIT, ", entryKey,
                                  " loaded from external file.  "
                                  "To change this value edit this file: ",
                                  path, "/CMakeCache.txt");
            e.SetProperty("HELPSTRING", helpString.c_str());
          }
          if (!this->ReadPropertyEntry(entryKey, e)) {
            e.Initialized = true;
            this->Cache[entryKey] = e;
          }
        }
      }
    } else {
      std::ostringstream error;
      error << "Parse error in cache file " << cacheFile << " on line "
            << lineno << ". Offending entry: " << realbuffer;
      cmSystemTools::Error(error.str());
    }
  }
  this->CacheMajorVersion = 0;
  this->CacheMinorVersion = 0;
  if (cmValue cmajor =
        this->GetInitializedCacheValue("CMAKE_CACHE_MAJOR_VERSION")) {
    unsigned int v = 0;
    if (sscanf(cmajor->c_str(), "%u", &v) == 1) {
      this->CacheMajorVersion = v;
    }
    if (cmValue cminor =
          this->GetInitializedCacheValue("CMAKE_CACHE_MINOR_VERSION")) {
      if (sscanf(cminor->c_str(), "%u", &v) == 1) {
        this->CacheMinorVersion = v;
      }
    }
  } else {
    // CMake version not found in the list file.
    // Set as version 0.0
    this->AddCacheEntry("CMAKE_CACHE_MINOR_VERSION", "0",
                        "Minor version of cmake used to create the "
                        "current loaded cache",
                        cmStateEnums::INTERNAL);
    this->AddCacheEntry("CMAKE_CACHE_MAJOR_VERSION", "0",
                        "Major version of cmake used to create the "
                        "current loaded cache",
                        cmStateEnums::INTERNAL);
  }
  // check to make sure the cache directory has not
  // been moved
  cmValue oldDir = this->GetInitializedCacheValue("CMAKE_CACHEFILE_DIR");
  if (internal && oldDir) {
    std::string currentcwd = path;
    std::string oldcwd = *oldDir;
    cmSystemTools::ConvertToUnixSlashes(currentcwd);
    currentcwd += "/CMakeCache.txt";
    oldcwd += "/CMakeCache.txt";
    if (!cmSystemTools::SameFile(oldcwd, currentcwd)) {
      cmValue dir = this->GetInitializedCacheValue("CMAKE_CACHEFILE_DIR");
      std::ostringstream message;
      message << "The current CMakeCache.txt directory " << currentcwd
              << " is different than the directory " << (dir ? *dir : "")
              << " where CMakeCache.txt was created. This may result "
                 "in binaries being created in the wrong place. If you "
                 "are not sure, reedit the CMakeCache.txt";
      cmSystemTools::Error(message.str());
    }
  }
  this->CacheLoaded = true;
  return true;
}